

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

int QIntC::IntConverter<unsigned_int,_int,_false,_true>::convert(uint *i)

{
  uint uVar1;
  type maxval;
  uint *i_local;
  
  uVar1 = std::numeric_limits<int>::max();
  if (uVar1 < *i) {
    error(*i);
  }
  return *i;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is unsigned, and to is signed. Convert To's max to the
            // unsigned version of To and compare i against that.
            auto maxval = static_cast<typename to_u<To>::type>(std::numeric_limits<To>::max());
            if (i > maxval) {
                error(i);
            }
            return static_cast<To>(i);
        }